

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O1

file_storage * __thiscall libtorrent::create_torrent::files(create_torrent *this)

{
  pointer this_00;
  int in_R8D;
  span<const_libtorrent::create_file_entry> files;
  file_storage local_d0;
  
  if ((this->m_file_storage_compat).super__Optional_base<libtorrent::file_storage,_false,_false>.
      _M_payload.super__Optional_payload<libtorrent::file_storage,_true,_false,_false>.
      super__Optional_payload_base<libtorrent::file_storage>._M_engaged == false) {
    this_00 = (this->m_files).
              super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
              .
              super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    files.m_ptr = ((long)(this->m_files).
                         super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                         .
                         super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3) *
                  0x2e8ba2e8ba2e8ba3;
    files.m_len._0_4_ = this->m_piece_length;
    files.m_len._4_4_ = 0;
    anon_unknown_40::make_file_storage(&local_d0,(anon_unknown_40 *)this_00,files,in_R8D);
    ::std::optional<libtorrent::file_storage>::operator=(&this->m_file_storage_compat,&local_d0);
    file_storage::~file_storage(&local_d0);
    *(undefined8 *)
     &(this->m_file_storage_compat).super__Optional_base<libtorrent::file_storage,_false,_false>.
      _M_payload.super__Optional_payload<libtorrent::file_storage,_true,_false,_false>.
      super__Optional_payload_base<libtorrent::file_storage>._M_payload =
         *(undefined8 *)&this->m_piece_length;
  }
  return (file_storage *)&this->m_file_storage_compat;
}

Assistant:

file_storage const& create_torrent::files() const
	{
		if (!m_file_storage_compat)
		{
			m_file_storage_compat = make_file_storage(m_files, m_piece_length);
			m_file_storage_compat->set_num_pieces(m_num_pieces);
			m_file_storage_compat->set_piece_length(m_piece_length);
		}
		return *m_file_storage_compat;
	}